

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void utf8_suite::test_C0_80(void)

{
  char input [5];
  decoder_type decoder;
  undefined4 local_17c;
  value_type local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_decoder<char> local_150;
  
  builtin_memcpy(local_178,"\"",5);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            (&local_150,(value_type (*) [5])local_178);
  local_170._M_dataplus._M_p._0_4_ = local_150.current.code;
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x798,"void utf8_suite::test_C0_80()",&local_170,&local_17c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_170,&local_150);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("decoder.string_value<std::string>()","\"\\xC0\\x80\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x799,"void utf8_suite::test_C0_80()",&local_170,anon_var_dwarf_6960);
  std::__cxx11::string::~string((string *)&local_170);
  return;
}

Assistant:

void test_C0_80()
{
    const char input[] = "\"\xC0\x80\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\xC0\x80");
}